

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void MoveBeforeTable(TidyDocImpl *doc,Node *row,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar1 = (doc->root).parent;
  pNVar2 = pNVar1;
  do {
    if (pNVar2 == (Node *)0x0) {
      pNVar3 = pNVar1->parent;
      row->parent = pNVar3;
      row->next = pNVar1;
      row->prev = pNVar1->prev;
      pNVar1->prev = row;
      if (row->prev != (Node *)0x0) {
        row->prev->next = row;
      }
      if (pNVar3->content != pNVar1) {
        return;
      }
LAB_0014061b:
      pNVar3->content = row;
      return;
    }
    if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_TABLE)) {
      pNVar3 = pNVar2->parent;
      row->parent = pNVar3;
      row->next = pNVar2;
      row->prev = pNVar2->prev;
      pNVar2->prev = row;
      if (row->prev != (Node *)0x0) {
        row->prev->next = row;
      }
      if (pNVar3->content != pNVar2) {
        return;
      }
      goto LAB_0014061b;
    }
    pNVar2 = pNVar2->parent;
  } while( true );
}

Assistant:

static void MoveBeforeTable( TidyDocImpl* ARG_UNUSED(doc), Node *row,
                             Node *node )
{
    Node *table;

    /* first find the table element */
    for (table = row->parent; table; table = table->parent)
    {
        if ( nodeIsTABLE(table) )
        {
            TY_(InsertNodeBeforeElement)( table, node );
            return;
        }
    }
    /* No table element */
    TY_(InsertNodeBeforeElement)( row->parent, node );
}